

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv__tcp_keepalive(int fd,int on,uint delay)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int cnt;
  int intvl;
  undefined4 local_18;
  undefined4 local_14;
  uint local_10;
  int local_c;
  
  local_10 = delay;
  local_c = on;
  iVar2 = setsockopt(fd,1,9,&local_c,4);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    return -*piVar3;
  }
  if (local_c != 0) {
    local_14 = 1;
    local_18 = 10;
    iVar2 = setsockopt(fd,6,4,&local_10,4);
    if (((iVar2 == 0) && (iVar2 = setsockopt(fd,6,5,&local_14,4), iVar2 == 0)) &&
       (iVar2 = setsockopt(fd,6,6,&local_18,4), iVar2 == 0)) {
      bVar1 = true;
      iVar2 = 0;
    }
    else {
      piVar3 = __errno_location();
      bVar1 = false;
      iVar2 = -*piVar3;
    }
    if (!bVar1) {
      return iVar2;
    }
  }
  return 0;
}

Assistant:

int uv__tcp_keepalive(int fd, int on, unsigned int delay) {
  if (setsockopt(fd, SOL_SOCKET, SO_KEEPALIVE, &on, sizeof(on)))
    return UV__ERR(errno);

#ifdef TCP_KEEPIDLE
  if (on) {
    int intvl = 1;  /*  1 second; same as default on Win32 */
    int cnt = 10;  /* 10 retries; same as hardcoded on Win32 */
    if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPIDLE, &delay, sizeof(delay)))
      return UV__ERR(errno);
    if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPINTVL, &intvl, sizeof(intvl)))
      return UV__ERR(errno);
    if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPCNT, &cnt, sizeof(cnt)))
      return UV__ERR(errno);
  }
#endif

  /* Solaris/SmartOS, if you don't support keep-alive,
   * then don't advertise it in your system headers...
   */
  /* FIXME(bnoordhuis) That's possibly because sizeof(delay) should be 1. */
#if defined(TCP_KEEPALIVE) && !defined(__sun)
  if (on && setsockopt(fd, IPPROTO_TCP, TCP_KEEPALIVE, &delay, sizeof(delay)))
    return UV__ERR(errno);
#endif

  return 0;
}